

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

string * __thiscall
t_markdown_generator::escape_html
          (string *__return_storage_ptr__,t_markdown_generator *this,string *str)

{
  byte bVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong firstpos;
  ostringstream result;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar3 = str->_M_string_length;
  if (uVar3 != 0) {
    firstpos = 0;
    do {
      uVar6 = firstpos + 1;
      uVar7 = firstpos;
      if (firstpos + 1 < uVar3) {
        uVar6 = uVar3;
      }
      do {
        bVar1 = (str->_M_dataplus)._M_p[uVar7];
        uVar3 = uVar7;
        if ((char)bVar1 < ' ') break;
        uVar7 = uVar7 + 1;
        uVar3 = uVar6;
      } while (uVar6 != uVar7);
      if (firstpos < uVar3) {
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   (char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                    local_1d0._M_dataplus._M_p._0_1_),local_1d0._M_string_length);
        firstpos = uVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
            &local_1d0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_
                                  ));
        }
      }
      if (str->_M_string_length <= firstpos) break;
      if (bVar1 < 0x20) {
        if ((bVar1 < 0xe) && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)) {
          local_1d0._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d0,1);
        }
      }
      else {
        if ((this->input_type_ == INPUT_UNKNOWN) &&
           (detect_input_encoding(this,str,firstpos), this->input_type_ == INPUT_UTF8)) {
          std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     (char *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                      local_1d0._M_dataplus._M_p._0_1_),local_1d0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
              &local_1d0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1d0._M_dataplus._M_p._1_7_,
                                     local_1d0._M_dataplus._M_p._0_1_));
          }
          break;
        }
        if (this->input_type_ != INPUT_PLAIN) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "Unexpected or unrecognized input encoding";
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"&#",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
      }
      firstpos = firstpos + 1;
      uVar3 = str->_M_string_length;
    } while (firstpos < uVar3);
  }
  std::__cxx11::stringbuf::str();
  psVar2 = local_1b0;
  escape_html_tags(local_1b0,this,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_) !=
      &local_1d0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1d0._M_dataplus._M_p._1_7_,local_1d0._M_dataplus._M_p._0_1_));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string t_markdown_generator::escape_html(std::string const& str) {
  // the generated HTML header says it is UTF-8 encoded
  // if UTF-8 input has been detected before, we don't need to change anything
  //if (input_type_ == INPUT_UTF8) {
  //  return escape_html_tags(str);
  //}

  // convert unsafe chars to their &#<num>; equivalent
  std::ostringstream result;
  unsigned char c = '?';
  unsigned int ic = 0;
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      ic = c;
      if ((32 > ic) || (127 < ic)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // some control code?
    if (ic <= 31) {
      switch (c) {
      case '\r':
      case '\n':
      case '\t':
        result << ' ';
        break;
      default: // silently consume all other ctrl chars
        break;
      }
      ++firstpos;
      continue;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // try to detect input encoding
    if (input_type_ == INPUT_UNKNOWN) {
      detect_input_encoding(str, firstpos);
      if (input_type_ == INPUT_UTF8) {
        lastpos = str.length();
        result << str.substr(firstpos, lastpos - firstpos);
        break;
      }
    }

    // convert the character to something useful based on the detected encoding
    switch (input_type_) {
    case INPUT_PLAIN:
      result << "&#" << ic << ";";
      ++firstpos;
      break;
    default:
      throw "Unexpected or unrecognized input encoding";
    }
  }

  return escape_html_tags(result.str());
}